

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

uint64_t getnumattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  char *pcVar1;
  ulonglong local_40;
  uint64_t res;
  char *cc;
  char *c;
  xmlAttr *attr_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  rnndb *db_local;
  
  c = (char *)attr;
  attr_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)db;
  cc = getattrib(db,file,line,attr);
  pcVar1 = strchr(cc,0x78);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(cc,0x58);
    if (pcVar1 == (char *)0x0) {
      local_40 = strtoull(cc,(char **)&res,10);
      goto LAB_00105ef5;
    }
  }
  local_40 = strtoull(cc,(char **)&res,0x10);
LAB_00105ef5:
  if (*(char *)res != '\0') {
    fprintf(_stderr,"%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n",pcStack_18,
            (ulong)attr_local._4_4_,cc,*(undefined8 *)(c + 0x10));
    file_local[0x80] = '\x01';
    file_local[0x81] = '\0';
    file_local[0x82] = '\0';
    file_local[0x83] = '\0';
  }
  return local_40;
}

Assistant:

static uint64_t getnumattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	char *cc;
	uint64_t res;
	if (strchr(c, 'x') || strchr(c, 'X'))
		res = strtoull(c, &cc, 16);
	else
		res = strtoull(c, &cc, 10);
	if (*cc)  {
		fprintf (stderr, "%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
		db->estatus = 1;
	}
	return res;
}